

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O2

void __thiscall
CryptoUtil_ConvertSignatureToDerHexEmpty_Test::~CryptoUtil_ConvertSignatureToDerHexEmpty_Test
          (CryptoUtil_ConvertSignatureToDerHexEmpty_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, ConvertSignatureToDerHexEmpty) {
  try {
    std::string hex_sig;
    SigHashType sig_type(SigHashAlgorithm::kSigHashAll);
    ByteData byte_data = CryptoUtil::ConvertSignatureToDer(hex_sig, sig_type);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "der encode error.");
    return;
  }
  ASSERT_TRUE(false);
}